

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_suite.cpp
# Opt level: O2

void container_suite::test_object_bool_one(void)

{
  encoder_type encoder;
  ostringstream result;
  undefined4 local_1cc;
  size_type local_1c8 [4];
  undefined **local_1a8 [5];
  ostringstream local_180 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  local_1a8[0] = &PTR__base_00114b78;
  local_1a8[1] = (undefined **)local_180;
  local_1c8[0] = trial::protocol::json::detail::basic_encoder<char,_24UL>::begin_object_value
                           ((basic_encoder<char,_24UL> *)local_1a8);
  local_1cc = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value<token::begin_object>()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x3b1,"void container_suite::test_object_bool_one()",local_1c8,&local_1cc);
  local_1c8[0] = trial::protocol::json::detail::basic_encoder<char,_24UL>::value
                           ((basic_encoder<char,_24UL> *)local_1a8,"false");
  local_1cc = 7;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value(\"false\")","7",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x3b2,"void container_suite::test_object_bool_one()",local_1c8,&local_1cc);
  local_1c8[0] = trial::protocol::json::detail::basic_encoder<char,_24UL>::name_separator_value
                           ((basic_encoder<char,_24UL> *)local_1a8);
  local_1cc = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value<token::detail::name_separator>()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x3b3,"void container_suite::test_object_bool_one()",local_1c8,&local_1cc);
  local_1c8[0] = trial::protocol::json::detail::basic_encoder<char,_24UL>::value
                           ((basic_encoder<char,_24UL> *)local_1a8,false);
  local_1cc = 5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value(false)","5",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x3b4,"void container_suite::test_object_bool_one()",local_1c8,&local_1cc);
  local_1c8[0] = trial::protocol::json::detail::basic_encoder<char,_24UL>::end_object_value
                           ((basic_encoder<char,_24UL> *)local_1a8);
  local_1cc = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value<token::end_object>()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x3b5,"void container_suite::test_object_bool_one()",local_1c8,&local_1cc);
  std::__cxx11::stringbuf::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[16]>
            ("result.str()","\"{\\\"false\\\":false}\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x3b6,"void container_suite::test_object_bool_one()",local_1c8,"{\"false\":false}");
  std::__cxx11::string::~string((string *)local_1c8);
  (*(code *)*local_1a8[0])();
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return;
}

Assistant:

void test_object_bool_one()
{
    std::ostringstream result;
    encoder_type encoder(result);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value<token::begin_object>(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value("false"), 7);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value<token::detail::name_separator>(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value(false), 5);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value<token::end_object>(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "{\"false\":false}");
}